

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O1

SUNErrCode N_VScaleVectorArray(int nvec,sunrealtype *c,N_Vector *X,N_Vector *Z)

{
  _func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  ulong uVar2;
  
  UNRECOVERED_JUMPTABLE = (*Z)->ops->nvscalevectorarray;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0
     ) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,c,X,Z);
    return SVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      (*(*Z)->ops->nvscale)(c[uVar2],X[uVar2],Z[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleVectorArray(int nvec, sunrealtype* c, N_Vector* X, N_Vector* Z)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (Z[0]->ops->nvscalevectorarray != NULL)
  {
    ier = Z[0]->ops->nvscalevectorarray(nvec, c, X, Z);
  }
  else
  {
    for (i = 0; i < nvec; i++) { Z[0]->ops->nvscale(c[i], X[i], Z[i]); }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}